

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

ostream * AixLog::operator<<(ostream *os,Severity *log_severity)

{
  ostream oVar1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *__s;
  string local_1c0 [32];
  Function local_1a0 [4];
  
  if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) != 0) &&
     (plVar3 = (long *)__dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                               *(long *)(std::clog + -0x18)),
                                      &std::streambuf::typeinfo,&Log::typeinfo,0),
     plVar3 != (long *)0x0)) {
    std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(plVar3 + 0x29))->__data);
    if (*(ostream *)(plVar3 + 0x10) != *os) {
      (**(code **)(*plVar3 + 0x30))(plVar3);
      *(ostream *)(plVar3 + 0x10) = *os;
      plVar3[0x23] = 0;
      *(undefined1 *)(plVar3 + 0x24) = 1;
      Tag::Tag((Tag *)local_1a0,(nullptr_t)0x0);
      Tag::operator=((Tag *)(plVar3 + 0x11),(Tag *)local_1a0);
      Tag::~Tag((Tag *)local_1a0);
      Function::Function(local_1a0,(nullptr_t)0x0);
      Function::operator=((Function *)(plVar3 + 0x17),local_1a0);
      Function::~Function(local_1a0);
      *(undefined1 *)(plVar3 + 0x25) = 1;
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)(plVar3 + 0x29));
    return (ostream *)CONCAT44(extraout_var,iVar2);
  }
  oVar1 = *os;
  switch(oVar1) {
  case (ostream)0x0:
    __s = "Trace";
    break;
  case (ostream)0x1:
    __s = "Debug";
    break;
  case (ostream)0x2:
    __s = "Info";
    break;
  case (ostream)0x3:
    __s = "Notice";
    break;
  case (ostream)0x4:
    __s = "Warn";
    break;
  case (ostream)0x5:
    __s = "Error";
    break;
  case (ostream)0x6:
    __s = "Fatal";
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
    std::ostream::operator<<(&local_1a0[0].name._M_string_length,(int)(char)oVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    goto LAB_0018bfb0;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,__s,(allocator<char> *)local_1a0);
LAB_0018bfb0:
  std::operator<<((ostream *)&std::clog,local_1c0);
  poVar4 = (ostream *)std::__cxx11::string::~string(local_1c0);
  return poVar4;
}

Assistant:

static std::ostream& operator<<(std::ostream& os,
                                const Severity& log_severity) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    if (log->metadata_.severity != log_severity) {
      log->sync();
      log->metadata_.severity = log_severity;
      log->metadata_.timestamp = nullptr;
      log->metadata_.tag = nullptr;
      log->metadata_.function = nullptr;
      log->conditional_.set(true);
    }
  } else {
    os << to_string(log_severity);
  }
  return os;
}